

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O2

void __thiscall DRunningScript::Serialize(DRunningScript *this,FArchive *arc)

{
  FArchive *pFVar1;
  long lVar2;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar1 = ::operator<<(arc,(DFsScript **)&this->script);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->save_point);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->wait_type);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->wait_data);
  pFVar1 = ::operator<<(pFVar1,(DRunningScript **)&this->prev);
  pFVar1 = ::operator<<(pFVar1,(DRunningScript **)&this->next);
  ::operator<<(pFVar1,(AActor **)&this->trigger);
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 8) {
    ::operator<<(arc,(DFsVariable **)((long)&this->variables[0].field_0 + lVar2));
  }
  return;
}

Assistant:

void DRunningScript::Serialize(FArchive &arc)
{
	Super::Serialize(arc);

	arc << script << save_point << wait_type << wait_data << prev << next << trigger;
	for(int i=0; i< VARIABLESLOTS; i++) arc << variables[i];
}